

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  lzma_match *matches;
  lzma_optimal *plVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  lzma_lzma_state lVar6;
  uint8_t *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint32_t i;
  uint32_t uVar11;
  uint uVar12;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  int iVar17;
  uint32_t uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  lzma_lzma_state lVar27;
  lzma_lzma_state lVar28;
  short *psVar29;
  uint32_t *puVar30;
  uint32_t *puVar31;
  lzma_lzma_state pos_state;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  lzma_lzma1_encoder *plVar35;
  short *psVar36;
  uint rep_index;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  lzma_lzma_state lVar41;
  uint32_t dist_slot;
  ulong uVar42;
  uint32_t *puVar43;
  ulong uVar44;
  byte bVar45;
  int iVar46;
  uint32_t (*pauVar47) [64];
  uint32_t i_1;
  uint uVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  uint32_t (*pauVar52) [128];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint32_t matches_count;
  uint32_t reps [4];
  
  uVar25 = coder->opts_current_index;
  uVar14 = mf->read_ahead;
  if (coder->opts_end_index == uVar25) {
    if (uVar14 == 0) {
      if (0x7f < coder->match_price_count) {
        pauVar47 = coder->dist_slot_prices;
        pauVar52 = coder->dist_prices;
        plVar35 = coder;
        for (lVar49 = 0; lVar49 != 4; lVar49 = lVar49 + 1) {
          for (uVar42 = 0; uVar50 = (ulong)coder->dist_table_size, uVar42 < uVar50;
              uVar42 = uVar42 + 1) {
            uVar11 = rc_bittree_price(coder->dist_slot[lVar49],6,(uint32_t)uVar42);
            (*pauVar47)[uVar42] = uVar11;
          }
          uVar25 = 0x70;
          for (lVar22 = 0x40b2; lVar22 - 0x40a4U < uVar50; lVar22 = lVar22 + 1) {
            (plVar35->rc).symbols[lVar22 + -10] =
                 ((uVar25 & 0xfffffff0) + (plVar35->rc).symbols[lVar22 + -10]) - 0x50;
            uVar50 = (ulong)coder->dist_table_size;
            uVar25 = uVar25 + 8;
          }
          for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
            (*pauVar52)[lVar22] = (*pauVar47)[lVar22];
          }
          pauVar47 = pauVar47 + 1;
          plVar35 = (lzma_lzma1_encoder *)((plVar35->rc).symbols + 0x36);
          pauVar52 = pauVar52 + 1;
        }
        puVar43 = coder->dist_prices[0] + 4;
        for (lVar49 = 4; lVar49 != 0x80; lVar49 = lVar49 + 1) {
          bVar2 = ""[lVar49];
          uVar11 = (bVar2 >> 1) - 1;
          uVar25 = (bVar2 & 1 | 2) << ((byte)uVar11 & 0x1f);
          uVar11 = rc_bittree_reverse_price
                             ((probability *)
                              ((long)coder + ((ulong)uVar25 * 2 - (ulong)((uint)bVar2 * 2)) + 0x70fa
                              ),uVar11,(int)lVar49 - uVar25);
          for (lVar22 = 0; lVar22 != 0x400; lVar22 = lVar22 + 0x100) {
            *(uint32_t *)((long)puVar43 + lVar22 * 2) =
                 *(int *)((long)coder->dist_slot_prices[0] + lVar22 + (ulong)bVar2 * 4) + uVar11;
          }
          puVar43 = puVar43 + 1;
        }
        coder->match_price_count = 0;
      }
      if (0xf < coder->align_price_count) {
        for (lVar49 = 0; lVar49 != 0x10; lVar49 = lVar49 + 1) {
          uVar11 = rc_bittree_reverse_price(coder->dist_align,4,(uint32_t)lVar49);
          coder->align_prices[lVar49] = uVar11;
        }
        coder->align_price_count = 0;
      }
    }
    uVar25 = mf->nice_len;
    if (uVar14 == 1) {
      matches_count = coder->matches_count;
      uVar12 = coder->longest_match_length;
    }
    else {
      if (uVar14 != 0) {
        __assert_fail("mf->read_ahead == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                      ,0x11c,
                      "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                     );
      }
      uVar12 = lzma_mf_find(mf,&matches_count,coder->matches);
    }
    uVar42 = (ulong)mf->read_pos;
    uVar26 = (mf->write_pos - mf->read_pos) + 1;
    uVar15 = 0x111;
    if ((uVar26 < 0x111) && (uVar15 = uVar26, uVar26 < 2)) {
      *back_res = 0xffffffff;
      *len_res = 1;
    }
    else {
      puVar7 = mf->buffer;
      puVar43 = coder->reps;
      sVar5 = *(short *)(puVar7 + (uVar42 - 1));
      uVar26 = 0;
      for (lVar49 = 0; lVar49 != 4; lVar49 = lVar49 + 1) {
        if (sVar5 == *(short *)(puVar7 + (uVar42 - 2) + -(ulong)puVar43[lVar49])) {
          uVar50 = 2;
LAB_00353467:
          uVar48 = uVar15;
          if (uVar50 < uVar15) {
            uVar34 = *(long *)(puVar7 + uVar50 + (uVar42 - 1)) -
                     *(long *)(puVar7 + uVar50 + (uVar42 - puVar43[lVar49]) + -2);
            if (uVar34 == 0) goto code_r0x00353478;
            uVar51 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
              }
            }
            uVar48 = (int)uVar50 + ((uint)(uVar51 >> 3) & 0x1fffffff);
            if (uVar15 <= uVar48) {
              uVar48 = uVar15;
            }
          }
          reps[lVar49] = uVar48;
          if (reps[uVar26] < uVar48) {
            uVar26 = (uint)lVar49;
          }
          goto LAB_003534aa;
        }
        reps[lVar49] = 0;
LAB_003534aa:
      }
      uVar15 = reps[uVar26];
      if (uVar15 < uVar25) {
        if (uVar12 < uVar25) {
          bVar2 = puVar7[~(ulong)*puVar43 + (uVar42 - 1)];
          bVar45 = (byte)sVar5;
          if (((uVar15 < 2) && (uVar12 < 2)) && (bVar2 != bVar45)) {
            *back_res = 0xffffffff;
          }
          else {
            lVar27 = coder->state;
            uVar34 = (ulong)lVar27;
            coder->opts[0].state = lVar27;
            uVar25 = coder->pos_mask & position;
            uVar50 = (ulong)(coder->is_match[uVar34][uVar25] >> 4);
            bVar3 = lzma_rc_prices[uVar50];
            uVar11 = get_literal_price(coder,position,(uint)puVar7[uVar42 - 2],6 < uVar34,
                                       (uint)bVar2,(uint)bVar45);
            coder->opts[1].price = uVar11 + bVar3;
            coder->opts[1].back_prev = 0xffffffff;
            coder->opts[1].prev_1_is_literal = false;
            bVar4 = lzma_rc_prices[uVar50 ^ 0x7f];
            uVar42 = (ulong)(coder->is_rep[uVar34] >> 4);
            iVar13 = (uint)lzma_rc_prices[uVar42 ^ 0x7f] + (uint)bVar4;
            uVar14 = 0xffffffff;
            if (bVar2 == bVar45) {
              uVar18 = get_short_rep_price(coder,lVar27,uVar25);
              uVar26 = uVar18 + iVar13;
              if (uVar26 < uVar11 + bVar3) {
                coder->opts[1].price = uVar26;
                coder->opts[1].back_prev = 0;
                coder->opts[1].prev_1_is_literal = false;
                uVar14 = 0;
              }
            }
            if (uVar15 < uVar12) {
              uVar15 = uVar12;
            }
            uVar50 = (ulong)uVar15;
            if (1 < uVar15) {
              coder->opts[1].pos_prev = 0;
              for (lVar49 = -4; auVar10 = _DAT_00414ba0, auVar9 = _DAT_00414b90,
                  auVar8 = _DAT_00414b80, lVar49 != 0; lVar49 = lVar49 + 1) {
                coder->opts[1].backs[lVar49 + -7] = (&coder->matches[0].len)[lVar49];
              }
              lVar49 = (ulong)(uVar15 - 1) - 1;
              auVar54._8_4_ = (int)lVar49;
              auVar54._0_8_ = lVar49;
              auVar54._12_4_ = (int)((ulong)lVar49 >> 0x20);
              puVar31 = &coder->opts[uVar50].price;
              uVar34 = 0;
              auVar54 = auVar54 ^ _DAT_00414ba0;
              do {
                auVar55._8_4_ = (int)uVar34;
                auVar55._0_8_ = uVar34;
                auVar55._12_4_ = (int)(uVar34 >> 0x20);
                auVar56 = (auVar55 | auVar9) ^ auVar10;
                iVar17 = auVar54._4_4_;
                if ((bool)(~(auVar56._4_4_ == iVar17 && auVar54._0_4_ < auVar56._0_4_ ||
                            iVar17 < auVar56._4_4_) & 1)) {
                  *puVar31 = 0x40000000;
                }
                if ((auVar56._12_4_ != auVar54._12_4_ || auVar56._8_4_ <= auVar54._8_4_) &&
                    auVar56._12_4_ <= auVar54._12_4_) {
                  puVar31[-0xb] = 0x40000000;
                }
                auVar55 = (auVar55 | auVar8) ^ auVar10;
                iVar32 = auVar55._4_4_;
                if (iVar32 <= iVar17 && (iVar32 != iVar17 || auVar55._0_4_ <= auVar54._0_4_)) {
                  puVar31[-0x16] = 0x40000000;
                  puVar31[-0x21] = 0x40000000;
                }
                uVar34 = uVar34 + 4;
                puVar31 = puVar31 + -0x2c;
              } while (((ulong)(uVar15 - 1) + 3 & 0xfffffffffffffffc) != uVar34);
              for (lVar49 = 0; uVar14 = matches_count, lVar49 != 4; lVar49 = lVar49 + 1) {
                uVar34 = (ulong)reps[lVar49];
                if (1 < uVar34) {
                  uVar14 = get_pure_rep_price(coder,(uint32_t)lVar49,lVar27,uVar25);
                  puVar31 = &coder->opts[uVar34].back_prev;
                  do {
                    uVar51 = uVar34 - 1;
                    uVar26 = (coder->rep_len_encoder).prices[(ulong)uVar25 - 1][uVar34 + 0x10e] +
                             uVar14 + iVar13;
                    if (uVar26 < puVar31[-2]) {
                      puVar31[-2] = uVar26;
                      puVar31[-1] = 0;
                      *puVar31 = (uint32_t)lVar49;
                      *(_Bool *)(puVar31 + -5) = false;
                    }
                    puVar31 = puVar31 + -0xb;
                    uVar34 = uVar51;
                  } while ((uVar51 & 0xfffffffe) != 0);
                }
              }
              uVar34 = (ulong)(reps[0] + 1);
              if (reps[0] < 2) {
                uVar34 = 2;
              }
              if ((uint)uVar34 <= uVar12) {
                bVar2 = lzma_rc_prices[uVar42];
                uVar42 = 0xffffffffffffffff;
                do {
                  uVar42 = (ulong)((int)uVar42 + 1);
                } while (coder->matches[uVar42].len < (uint)uVar34);
                while( true ) {
                  uVar11 = coder->matches[uVar42].dist;
                  uVar16 = (uint32_t)uVar34;
                  uVar18 = get_dist_len_price(coder,uVar11,uVar16,uVar25);
                  uVar12 = uVar18 + (uint)bVar2 + (uint)bVar4;
                  if (uVar12 < coder->opts[uVar34].price) {
                    coder->opts[uVar34].price = uVar12;
                    coder->opts[uVar34].pos_prev = 0;
                    coder->opts[uVar34].back_prev = uVar11 + 4;
                    coder->opts[uVar34].prev_1_is_literal = false;
                  }
                  uVar11 = coder->matches[uVar42].len;
                  uVar12 = (int)uVar42 + 1;
                  if ((uVar16 == uVar11) && (uVar12 == uVar14)) break;
                  uVar51 = (ulong)uVar12;
                  if (uVar16 != uVar11) {
                    uVar51 = uVar42;
                  }
                  uVar34 = (ulong)(uVar16 + 1);
                  uVar42 = uVar51;
                }
              }
              if (uVar15 == 0xffffffff) {
                return;
              }
              reps._0_8_ = *(undefined8 *)puVar43;
              reps._8_8_ = *(undefined8 *)(coder->reps + 2);
              matches = coder->matches;
              puVar43 = coder->opts[1].backs;
              iVar13 = 2;
              uVar42 = 1;
              while( true ) {
                uVar34 = uVar50 & 0xffffffff;
                uVar14 = (uint32_t)uVar42;
                if (uVar34 <= uVar42) break;
                if (uVar42 == 0x1000) {
                  __assert_fail("cur < OPTS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                                ,0x348,
                                "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                               );
                }
                uVar11 = lzma_mf_find(mf,&coder->matches_count,matches);
                coder->longest_match_length = uVar11;
                uVar25 = mf->nice_len;
                if (uVar25 <= uVar11) break;
                puVar7 = mf->buffer;
                uVar51 = (ulong)mf->read_pos;
                uVar15 = (mf->write_pos - mf->read_pos) + 1;
                uVar12 = 0xfff - uVar14;
                if (uVar15 < 0xfff - uVar14) {
                  uVar12 = uVar15;
                }
                uVar15 = coder->matches_count;
                plVar1 = coder->opts + uVar42;
                uVar26 = coder->opts[uVar42].pos_prev;
                uVar23 = (ulong)uVar26;
                if (coder->opts[uVar42].prev_1_is_literal == true) {
                  uVar26 = uVar26 - 1;
                  if (plVar1->prev_2 == true) {
                    lVar27 = coder->opts[plVar1->pos_prev_2].state;
                    if (plVar1->back_prev_2 < 4) {
                      lVar41 = (uint)(STATE_SHORTREP_LIT < lVar27) * 3 + STATE_LIT_LONGREP;
                    }
                    else {
                      lVar41 = (uint)(STATE_SHORTREP_LIT < lVar27) * 3 + STATE_LIT_MATCH;
                    }
                  }
                  else {
                    lVar41 = coder->opts[uVar26].state;
                  }
                  lVar27 = (lVar41 - STATE_SHORTREP_LIT) + (uint)(lVar41 < STATE_NONLIT_MATCH) * 3;
                  if (lVar41 < STATE_MATCH_LIT) {
                    lVar27 = STATE_LIT_LIT;
                  }
                  if (uVar42 == uVar23) {
LAB_00353a59:
                    if (plVar1->back_prev == 0) {
                      uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 2 + 9);
                    }
                    else {
                      uVar23 = (ulong)((lVar27 - STATE_SHORTREP_LIT) +
                                      (uint)(lVar27 < STATE_NONLIT_MATCH) * 3);
                      if (lVar27 < STATE_MATCH_LIT) {
                        uVar23 = 0;
                      }
                    }
                  }
                  else {
                    if (plVar1->prev_2 == false) goto LAB_00353ac1;
                    uVar26 = plVar1->pos_prev_2;
                    uVar48 = plVar1->back_prev_2;
                    uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 3 + 8);
                    if (uVar48 < 4) goto LAB_00353adc;
LAB_00353b52:
                    reps[0] = uVar48 - 4;
                    for (lVar49 = 0; lVar49 != 3; lVar49 = lVar49 + 1) {
                      reps[lVar49 + 1] = coder->opts[uVar26].backs[lVar49];
                    }
                  }
                }
                else {
                  lVar27 = coder->opts[uVar23].state;
                  if (uVar42 - 1 == uVar23) goto LAB_00353a59;
LAB_00353ac1:
                  uVar48 = plVar1->back_prev;
                  if (3 < uVar48) {
                    uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 3 + 7);
                    goto LAB_00353b52;
                  }
                  uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar27) * 3 + 8);
LAB_00353adc:
                  uVar44 = (ulong)uVar48;
                  reps[0] = coder->opts[uVar26].backs[uVar44];
                  for (uVar39 = 0; uVar44 != uVar39; uVar39 = uVar39 + 1) {
                    reps[uVar39 + 1] = coder->opts[uVar26].backs[uVar39];
                  }
                  while (uVar44 + 1 < 4) {
                    reps[uVar44 + 1] = coder->opts[uVar26].backs[uVar44 + 1];
                    uVar44 = uVar44 + 1;
                  }
                }
                psVar29 = (short *)(puVar7 + (uVar51 - 1));
                lVar27 = position + uVar14;
                lVar41 = (lzma_lzma_state)uVar23;
                plVar1->state = lVar41;
                for (lVar49 = 0; lVar49 != 4; lVar49 = lVar49 + 1) {
                  puVar43[lVar49] = reps[lVar49];
                }
                uVar18 = plVar1->price;
                bVar2 = puVar7[uVar51 - 1];
                uVar44 = reps._0_8_ & 0xffffffff;
                bVar45 = puVar7[(uVar51 - uVar44) + -2];
                lVar6 = coder->pos_mask;
                pos_state = lVar6 & lVar27;
                uVar39 = (ulong)(coder->is_match[uVar23][pos_state] >> 4);
                bVar3 = lzma_rc_prices[uVar39];
                uVar16 = get_literal_price(coder,lVar27,(uint)puVar7[uVar51 - 2],
                                           STATE_SHORTREP_LIT < lVar41,(uint)bVar45,(uint)bVar2);
                uVar48 = uVar16 + uVar18 + (uint)bVar3;
                uVar26 = coder->opts[uVar42 + 1].price;
                bVar53 = uVar48 < uVar26;
                if (bVar53) {
                  coder->opts[uVar42 + 1].price = uVar48;
                  coder->opts[uVar42 + 1].pos_prev = uVar14;
                  coder->opts[uVar42 + 1].back_prev = 0xffffffff;
                  coder->opts[uVar42 + 1].prev_1_is_literal = false;
                  uVar26 = uVar48;
                }
                iVar32 = uVar18 + lzma_rc_prices[uVar39 ^ 0x7f];
                uVar23 = (ulong)(coder->is_rep[uVar23] >> 4);
                iVar17 = (uint)lzma_rc_prices[uVar23 ^ 0x7f] + iVar32;
                if ((bVar45 == bVar2) &&
                   ((uVar42 <= coder->opts[uVar42 + 1].pos_prev ||
                    (coder->opts[uVar42 + 1].back_prev != 0)))) {
                  uVar18 = get_short_rep_price(coder,lVar41,pos_state);
                  uVar19 = uVar18 + iVar17;
                  if (uVar19 <= uVar26) {
                    coder->opts[uVar42 + 1].price = uVar19;
                    coder->opts[uVar42 + 1].pos_prev = uVar14;
                    coder->opts[uVar42 + 1].back_prev = 0;
                    coder->opts[uVar42 + 1].prev_1_is_literal = false;
                    bVar53 = true;
                  }
                }
                if (1 < uVar12) {
                  uVar26 = uVar25;
                  if (uVar12 < uVar25) {
                    uVar26 = uVar12;
                  }
                  if (bVar45 != bVar2 && !bVar53) {
                    uVar19 = uVar25 + 1;
                    if (uVar12 <= uVar25 + 1) {
                      uVar19 = uVar12;
                    }
                    if (uVar25 != 0xffffffff) {
                      uVar37 = 1;
LAB_00353dd2:
                      uVar33 = uVar19;
                      if (uVar37 < uVar19) {
                        uVar39 = *(long *)((long)psVar29 + (ulong)uVar37) -
                                 *(long *)((long)psVar29 + (ulong)uVar37 + ~uVar44);
                        if (uVar39 == 0) goto code_r0x00353deb;
                        uVar44 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        uVar33 = ((uint)(uVar44 >> 3) & 0x1fffffff) + uVar37;
                        if (uVar19 <= uVar33) {
                          uVar33 = uVar19;
                        }
                      }
                      if (1 < uVar33 - 1) {
                        uVar19 = (lVar41 - STATE_SHORTREP_LIT) +
                                 (uint)(lVar41 < STATE_NONLIT_MATCH) * 3;
                        if (lVar41 < STATE_MATCH_LIT) {
                          uVar19 = 0;
                        }
                        lVar28 = lVar27 + STATE_MATCH_LIT_LIT & lVar6;
                        bVar2 = lzma_rc_prices[(ulong)(coder->is_match[uVar19][lVar28] >> 4) ^ 0x7f]
                        ;
                        bVar45 = lzma_rc_prices[(ulong)(coder->is_rep[uVar19] >> 4) ^ 0x7f];
                        uVar44 = (ulong)(uVar33 + uVar14);
                        puVar31 = &coder->opts[uVar34 + 1].price;
                        for (; uVar34 < uVar44; uVar34 = uVar34 + 1) {
                          *puVar31 = 0x40000000;
                          puVar31 = puVar31 + 0xb;
                        }
                        uVar18 = get_rep_price(coder,uVar33 - 1,uVar19,lVar28,(uint32_t)puVar31);
                        uVar48 = uVar18 + uVar48 + bVar2 + (uint)bVar45;
                        uVar50 = uVar34;
                        if (uVar48 < coder->opts[uVar44].price) {
                          coder->opts[uVar44].price = uVar48;
                          coder->opts[uVar44].pos_prev = (uint32_t)(uVar42 + 1);
                          coder->opts[uVar44].back_prev = 0;
                          coder->opts[uVar44].prev_1_is_literal = true;
                          coder->opts[uVar44].prev_2 = false;
                        }
                      }
                      goto LAB_00353eef;
                    }
LAB_003546ce:
                    __assert_fail("len <= limit",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                                  ,0x2e,
                                  "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                                 );
                  }
LAB_00353eef:
                  sVar5 = *psVar29;
                  uVar34 = 2;
                  for (lVar49 = 0; uVar44 = uVar50 & 0xffffffff, lVar49 != 4; lVar49 = lVar49 + 1) {
                    psVar36 = (short *)(puVar7 + ((uVar51 - 2) - (ulong)reps[lVar49]));
                    if (sVar5 == *psVar36) {
                      if (1 < uVar26) {
                        uVar48 = 2;
LAB_00353f9f:
                        uVar50 = (ulong)uVar26;
                        if (uVar48 < uVar26) {
                          uVar50 = *(long *)((long)psVar29 + (ulong)uVar48) -
                                   *(long *)((long)psVar36 + (ulong)uVar48);
                          if (uVar50 == 0) goto code_r0x00353fb2;
                          uVar39 = 0;
                          if (uVar50 != 0) {
                            for (; (uVar50 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                            }
                          }
                          uVar48 = ((uint)(uVar39 >> 3) & 0x1fffffff) + uVar48;
                          uVar50 = (ulong)uVar48;
                          if (uVar26 <= uVar48) {
                            uVar50 = (ulong)uVar26;
                          }
                        }
                        iVar38 = (int)uVar50;
                        uVar48 = iVar38 + uVar14;
                        puVar31 = &coder->opts[uVar44 + 1].price;
                        for (; uVar44 < uVar48; uVar44 = uVar44 + 1) {
                          *puVar31 = 0x40000000;
                          puVar31 = puVar31 + 0xb;
                        }
                        uVar16 = (uint32_t)lVar49;
                        uVar18 = get_pure_rep_price(coder,uVar16,lVar41,pos_state);
                        iVar46 = uVar18 + iVar17;
                        puVar30 = (coder->rep_len_encoder).prices[pos_state] + (iVar38 - 2U);
                        uVar39 = uVar50;
                        do {
                          uVar37 = *puVar30 + iVar46;
                          uVar19 = uVar14 + (int)uVar39;
                          if (uVar37 < coder->opts[uVar19].price) {
                            coder->opts[uVar19].price = uVar37;
                            coder->opts[uVar19].pos_prev = uVar14;
                            coder->opts[uVar19].back_prev = uVar16;
                            coder->opts[uVar19].prev_1_is_literal = false;
                          }
                          uVar19 = (int)uVar39 - 1;
                          uVar39 = (ulong)uVar19;
                          puVar30 = puVar30 + -1;
                        } while (1 < uVar19);
                        uVar19 = iVar38 + 1;
                        uVar39 = (ulong)uVar19;
                        if (lVar49 == 0) {
                          uVar34 = (ulong)uVar19;
                        }
                        uVar37 = uVar25 + iVar38 + 1;
                        if (uVar12 <= uVar37) {
                          uVar37 = uVar12;
                        }
                        uVar24 = (ulong)uVar37;
                        if (uVar37 <= uVar19) {
                          uVar24 = (ulong)uVar19;
                        }
                        for (; (uVar40 = uVar24, uVar39 < uVar37 &&
                               (uVar40 = uVar39,
                               puVar7[uVar39 + (uVar51 - 1)] == *(uint8_t *)((long)psVar36 + uVar39)
                               )); uVar39 = uVar39 + 1) {
                        }
                        uVar19 = (int)uVar40 - uVar19;
                        if (uVar19 < 2) {
LAB_00354209:
                          uVar50 = uVar44 & 0xffffffff;
                        }
                        else {
                          uVar18 = (coder->rep_len_encoder).prices[pos_state][iVar38 - 2U];
                          bVar2 = lzma_rc_prices
                                  [*(ushort *)
                                    ((long)coder->is_match[0] +
                                    (ulong)(iVar38 + lVar27 & lVar6) * 2 +
                                    (ulong)(((uint)(STATE_SHORTREP_LIT < lVar41) * 3 + 8) * 0x20))
                                   >> 4];
                          uVar20 = get_literal_price(coder,iVar38 + lVar27,
                                                     (uint)*(byte *)((long)psVar29 +
                                                                    (ulong)(iVar38 - 1)),true,
                                                     (uint)*(byte *)((long)psVar36 + uVar50),
                                                     (uint)*(byte *)((long)psVar29 + uVar50));
                          lVar28 = lVar27 + iVar38 + STATE_MATCH_LIT_LIT & lVar6;
                          bVar45 = lzma_rc_prices[(ulong)(coder->is_match[5][lVar28] >> 4) ^ 0x7f];
                          bVar3 = lzma_rc_prices[(ulong)(coder->is_rep[5] >> 4) ^ 0x7f];
                          uVar50 = (ulong)(uVar48 + uVar19 + 1);
                          for (; uVar44 < uVar50; uVar44 = uVar44 + 1) {
                            *puVar31 = 0x40000000;
                            puVar31 = puVar31 + 0xb;
                          }
                          uVar21 = get_rep_price(coder,uVar19,5,lVar28,(uint)bVar3);
                          uVar19 = uVar21 + uVar18 + iVar46 + (uint)bVar2 + uVar20 + (uint)bVar45 +
                                            (uint)bVar3;
                          if (uVar19 < coder->opts[uVar50].price) {
                            coder->opts[uVar50].price = uVar19;
                            coder->opts[uVar50].pos_prev = uVar48 + 1;
                            coder->opts[uVar50].back_prev = 0;
                            coder->opts[uVar50].prev_1_is_literal = true;
                            coder->opts[uVar50].prev_2 = true;
                            coder->opts[uVar50].pos_prev_2 = uVar14;
                            coder->opts[uVar50].back_prev_2 = uVar16;
                            goto LAB_00354209;
                          }
                          uVar50 = uVar44 & 0xffffffff;
                        }
                        goto LAB_00354245;
                      }
                      goto LAB_003546ce;
                    }
LAB_00354245:
                  }
                  if (uVar26 < uVar11) {
                    uVar15 = 0;
                    do {
                      uVar48 = uVar15;
                      uVar15 = uVar48 + 1;
                    } while (matches[uVar48].len < uVar26);
                    matches[uVar48].len = uVar26;
                    uVar11 = uVar26;
                  }
                  if ((uint)uVar34 <= uVar11) {
                    bVar2 = lzma_rc_prices[uVar23];
                    puVar31 = &coder->opts[uVar44 + 1].price;
                    for (; uVar44 < uVar11 + uVar14; uVar44 = uVar44 + 1) {
                      *puVar31 = 0x40000000;
                      puVar31 = puVar31 + 0xb;
                    }
                    uVar23 = 0xffffffff;
                    do {
                      uVar23 = (ulong)((int)uVar23 + 1);
                    } while (matches[uVar23].len < (uint)uVar34);
                    uVar50 = uVar44 & 0xffffffff;
                    uVar44 = uVar34;
                    do {
                      uVar11 = matches[uVar23].len;
                      uVar26 = coder->matches[uVar23].dist;
                      iVar17 = (int)uVar44;
                      uVar48 = iVar13 + iVar17;
                      iVar38 = (int)uVar34;
                      while( true ) {
                        uVar16 = (uint32_t)uVar34;
                        uVar18 = get_dist_len_price(coder,uVar26,uVar16,pos_state);
                        uVar19 = uVar18 + iVar32 + (uint)bVar2;
                        uVar37 = uVar16 + uVar14;
                        if (uVar19 < coder->opts[uVar37].price) {
                          coder->opts[uVar37].price = uVar19;
                          coder->opts[uVar37].pos_prev = uVar14;
                          coder->opts[uVar37].back_prev = uVar26 + 4;
                          coder->opts[uVar37].prev_1_is_literal = false;
                        }
                        uVar44 = (ulong)((int)uVar44 + 1);
                        if (uVar16 == uVar11) break;
                        uVar34 = (ulong)(uVar16 + 1);
                        uVar48 = uVar48 + 1;
                      }
                      lVar49 = (uVar51 - 2) - (ulong)uVar26;
                      uVar33 = uVar25 + uVar16 + 1;
                      if (uVar12 <= uVar33) {
                        uVar33 = uVar12;
                      }
                      rep_index = iVar17 - iVar38;
                      for (uVar39 = uVar44;
                          (uVar39 < uVar33 &&
                          (puVar7[uVar39 + (uVar51 - 1)] == puVar7[uVar39 + lVar49]));
                          uVar39 = uVar39 + 1) {
                        rep_index = rep_index + 1;
                        uVar48 = uVar48 + 1;
                      }
                      if (1 < rep_index) {
                        lVar28 = uVar16 + lVar27 & lVar6;
                        bVar45 = lzma_rc_prices
                                 [*(ushort *)
                                   ((long)coder->is_match[0] +
                                   (ulong)lVar28 * 2 +
                                   (ulong)(((uint)(STATE_SHORTREP_LIT < lVar41) * 3 + 7) * 0x20)) >>
                                  4];
                        uVar11 = get_literal_price(coder,uVar16 + lVar27,
                                                   (uint)*(byte *)((long)psVar29 +
                                                                  (ulong)(uVar16 - 1)),true,
                                                   (uint)puVar7[uVar34 + lVar49],
                                                   (uint)*(byte *)((long)psVar29 + uVar34));
                        lVar28 = lVar28 + STATE_MATCH_LIT_LIT & lVar6;
                        bVar3 = lzma_rc_prices[(ulong)(coder->is_match[4][lVar28] >> 4) ^ 0x7f];
                        bVar4 = lzma_rc_prices[(ulong)(coder->is_rep[4] >> 4) ^ 0x7f];
                        uVar50 = uVar50 & 0xffffffff;
                        uVar34 = (ulong)uVar48;
                        puVar31 = &coder->opts[uVar50 + 1].price;
                        for (; uVar50 < uVar34; uVar50 = uVar50 + 1) {
                          *puVar31 = 0x40000000;
                          puVar31 = puVar31 + 0xb;
                        }
                        uVar18 = get_rep_price(coder,rep_index,4,lVar28,(uint)bVar3);
                        uVar48 = uVar18 + uVar19 + bVar45 + uVar11 + (uint)bVar3 + (uint)bVar4;
                        if (uVar48 < coder->opts[uVar34].price) {
                          coder->opts[uVar34].price = uVar48;
                          coder->opts[uVar34].pos_prev = uVar37 + 1;
                          coder->opts[uVar34].back_prev = 0;
                          coder->opts[uVar34].prev_1_is_literal = true;
                          coder->opts[uVar34].prev_2 = true;
                          coder->opts[uVar34].pos_prev_2 = uVar14;
                          coder->opts[uVar34].back_prev_2 = uVar26 + 4;
                        }
                      }
                      uVar34 = (ulong)(uVar16 + 1);
                      uVar26 = (int)uVar23 + 1;
                      uVar23 = (ulong)uVar26;
                    } while (uVar26 != uVar15);
                  }
                }
                puVar43 = puVar43 + 0xb;
                iVar13 = iVar13 + 1;
                uVar42 = uVar42 + 1;
              }
              coder->opts_end_index = uVar14;
              uVar25 = coder->opts[uVar42 & 0xffffffff].pos_prev;
              uVar14 = coder->opts[uVar42 & 0xffffffff].back_prev;
              do {
                uVar34 = (ulong)uVar25;
                uVar50 = uVar42 & 0xffffffff;
                if (coder->opts[uVar50].prev_1_is_literal == false) {
                  uVar12 = coder->opts[uVar34].pos_prev;
                  uVar11 = coder->opts[uVar34].back_prev;
                }
                else {
                  coder->opts[uVar34].prev_1_is_literal = false;
                  uVar12 = uVar25 - 1;
                  if (coder->opts[uVar50].prev_2 == true) {
                    coder->opts[uVar12].prev_1_is_literal = false;
                    uVar11 = coder->opts[uVar50].back_prev_2;
                    coder->opts[uVar12].pos_prev = coder->opts[uVar50].pos_prev_2;
                    coder->opts[uVar12].back_prev = uVar11;
                  }
                  uVar11 = 0xffffffff;
                }
                coder->opts[uVar34].back_prev = uVar14;
                coder->opts[uVar34].pos_prev = (uint32_t)uVar42;
                bVar53 = uVar25 != 0;
                uVar42 = uVar34;
                uVar25 = uVar12;
                uVar14 = uVar11;
              } while (bVar53);
              uVar14 = coder->opts[0].pos_prev;
              coder->opts_current_index = uVar14;
              *len_res = uVar14;
              *back_res = coder->opts[0].back_prev;
              return;
            }
            *back_res = uVar14;
          }
          *len_res = 1;
          return;
        }
        *back_res = coder->matches[matches_count - 1].dist + 4;
        *len_res = uVar12;
        uVar15 = uVar12;
      }
      else {
        *back_res = uVar26;
        *len_res = uVar15;
      }
      mf_skip(mf,uVar15 - 1);
    }
  }
  else {
    if (uVar14 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x327,
                    "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar14 = coder->opts[uVar25].pos_prev;
    uVar11 = coder->opts[uVar25].back_prev;
    coder->opts_current_index = uVar14;
    *len_res = uVar14 - uVar25;
    *back_res = uVar11;
  }
  return;
code_r0x00353478:
  uVar50 = uVar50 + 8;
  goto LAB_00353467;
code_r0x00353deb:
  uVar37 = uVar37 + 8;
  goto LAB_00353dd2;
code_r0x00353fb2:
  uVar48 = uVar48 + 8;
  goto LAB_00353f9f;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}